

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<_db0c8446_> __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>,slang::ast::PackageSymbol_const*,slang::Hasher<slang::ast::PackageSymbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::PackageSymbol_const*,std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>,slang::Hasher<slang::ast::PackageSymbol_const*>>,std::equal_to<slang::ast:...cator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>>>>
::
emplace<std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>>
          (sherwood_v3_table<std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>,slang::ast::PackageSymbol_const*,slang::Hasher<slang::ast::PackageSymbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::PackageSymbol_const*,std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>,slang::Hasher<slang::ast::PackageSymbol_const*>>,std::equal_to<slang::ast:___cator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>>>>
           *this,pair<const_slang::ast::PackageSymbol_*,_ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                 *key)

{
  bool bVar1;
  size_t hash;
  undefined8 extraout_RDX;
  pair<_db0c8446_> pVar2;
  pair<_db0c8446_> pVar3;
  bool local_49;
  templated_iterator<std::pair<const_slang::ast::PackageSymbol_*,_ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>_>
  local_48;
  char local_39;
  EntryPointer psStack_38;
  int8_t distance_from_desired;
  EntryPointer current_entry;
  size_t index;
  pair<const_slang::ast::PackageSymbol_*,_ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *key_local;
  sherwood_v3_table<_b062436f_> *this_local;
  bool local_10;
  
  index = (size_t)key;
  key_local = (pair<const_slang::ast::PackageSymbol_*,_ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
               *)this;
  hash = hash_object<std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>>
                   (this,key);
  current_entry =
       (EntryPointer)
       fibonacci_hash_policy::index_for_hash
                 ((fibonacci_hash_policy *)(this + 0x10),hash,*(size_t *)(this + 8));
  psStack_38 = (EntryPointer)(*(long *)this + (long)current_entry * 0x30);
  local_39 = '\0';
  do {
    if (psStack_38->distance_from_desired < local_39) {
      pVar2 = emplace_new_key<std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>>
                        (this,local_39,psStack_38,
                         (pair<const_slang::ast::PackageSymbol_*,_ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                          *)index);
      local_10 = pVar2.second;
LAB_003b824e:
      this_local = (sherwood_v3_table<_b062436f_> *)pVar2.first.current;
      pVar3._9_7_ = pVar2._9_7_;
      pVar3.second = local_10;
      pVar3.first.current = (EntryPointer)this_local;
      return pVar3;
    }
    bVar1 = compares_equal<std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>,std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>>
                      (this,(pair<const_slang::ast::PackageSymbol_*,_ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                             *)index,&(psStack_38->field_1).value);
    if (bVar1) {
      sherwood_v3_table<$b062436f$>::
      templated_iterator<std::pair<const_slang::ast::PackageSymbol_*,_ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>_>
      ::templated_iterator(&local_48,psStack_38);
      local_49 = false;
      std::pair<$db0c8446$>::pair<bool,_true>((pair<_db0c8446_> *)&this_local,&local_48,&local_49);
      pVar2._8_8_ = extraout_RDX;
      pVar2.first.current = (EntryPointer)this_local;
      goto LAB_003b824e;
    }
    psStack_38 = psStack_38 + 1;
    local_39 = local_39 + '\x01';
  } while( true );
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }